

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

QPDFObjectHandle __thiscall
NNTreeIterator::getNextKid(NNTreeIterator *this,PathElement *pe,bool backward)

{
  int iVar1;
  QPDF *qpdf;
  bool bVar2;
  int iVar3;
  string *key;
  byte in_CL;
  undefined7 in_register_00000011;
  string *key_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  QPDFObjectHandle QVar5;
  bool local_14a;
  bool local_139;
  QPDFObjectHandle local_f8;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle kids;
  bool found;
  bool backward_local;
  PathElement *pe_local;
  NNTreeIterator *this_local;
  QPDFObjectHandle *result;
  
  key_00 = (string *)CONCAT71(in_register_00000011,backward);
  kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = in_CL & 1;
  kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 0;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
  kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._5_1_ = 0;
  _Var4._M_pi = extraout_RDX;
  while (((kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._5_1_ ^ 0xff) & 1) != 0) {
    *(uint *)&key_00->field_2 =
         *(int *)&key_00->field_2 +
         (-(kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._7_1_ & 1) | 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"/Kids",&local_59);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_38,key_00);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    if ((*(int *)&key_00->field_2 < 0) ||
       (iVar1 = *(int *)&key_00->field_2,
       iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_38), iVar3 <= iVar1)) {
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
      kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_1_ = 1;
    }
    else {
      QPDFObjectHandle::getArrayItem(local_80,(int)local_38);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,local_80);
      QPDFObjectHandle::~QPDFObjectHandle(local_80);
      local_a2 = 0;
      local_a3 = 0;
      bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
      local_139 = false;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/Kids",&local_a1);
        local_a3 = 1;
        bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,&local_a0);
        local_14a = true;
        if (!bVar2) {
          key = (string *)
                (**(code **)*((pe->node).super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_vptr__Sp_counted_base)();
          local_14a = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,key);
        }
        local_139 = local_14a;
      }
      if ((local_a3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((local_a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_a1);
      }
      if (local_139 == false) {
        QTC::TC("qpdf","NNTree skip invalid kid",0);
        qpdf = *(QPDF **)&((pe->node).super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count;
        std::__cxx11::to_string(&local_e8,*(int *)&key_00->field_2);
        std::operator+(&local_c8,"skipping over invalid kid at index ",&local_e8);
        warn(qpdf,(QPDFObjectHandle *)key_00,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      else {
        kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._5_1_ = 1;
      }
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
    _Var4._M_pi = extraout_RDX_00;
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
NNTreeIterator::getNextKid(PathElement& pe, bool backward)
{
    QPDFObjectHandle result;
    bool found = false;
    while (!found) {
        pe.kid_number += backward ? -1 : 1;
        auto kids = pe.node.getKey("/Kids");
        if ((pe.kid_number >= 0) && (pe.kid_number < kids.getArrayNItems())) {
            result = kids.getArrayItem(pe.kid_number);
            if (result.isDictionary() &&
                (result.hasKey("/Kids") || result.hasKey(impl.details.itemsKey()))) {
                found = true;
            } else {
                QTC::TC("qpdf", "NNTree skip invalid kid");
                warn(
                    impl.qpdf,
                    pe.node,
                    ("skipping over invalid kid at index " + std::to_string(pe.kid_number)));
            }
        } else {
            result = QPDFObjectHandle::newNull();
            found = true;
        }
    }
    return result;
}